

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserColour.cpp
# Opt level: O0

bool Rml::PropertyParserColour::ParseColour(Colourb *colour,String *value)

{
  char cVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  undefined8 uVar9;
  undefined1 *puVar10;
  size_type sVar11;
  reference pvVar12;
  long lVar13;
  reference pvVar14;
  uchar *puVar15;
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Colour<unsigned_char,_255,_false>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pTVar16;
  pointer ppVar17;
  double dVar18;
  const_iterator cVar19;
  bool local_2a1;
  const_iterator local_288;
  String local_278;
  String local_258;
  undefined1 local_238 [8];
  const_iterator it;
  string local_220 [4];
  int i_4;
  int local_1fc;
  const_iterator piStack_1f8;
  int i_3;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  initializer_list<int> local_1e0;
  initializer_list<int> *local_1d0;
  initializer_list<int> *__range4_1;
  const_iterator piStack_1c0;
  int i_2;
  const_iterator __end4;
  const_iterator __begin4;
  initializer_list<int> local_1a8;
  initializer_list<int> *local_198;
  initializer_list<int> *__range4;
  Array<float,_4> vals;
  string local_158 [36];
  int local_134;
  int local_130;
  int component;
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  String local_e8;
  long local_c8;
  size_t begin_values;
  long local_b8;
  size_t find;
  StringList values;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  int local_3c;
  int local_38;
  int ones;
  int tens;
  int i;
  char hex_values [4] [2];
  String *value_local;
  Colourb *colour_local;
  
  uVar7 = ::std::__cxx11::string::empty();
  if ((uVar7 & 1) != 0) {
    colour_local._7_1_ = 0;
    goto LAB_005e8783;
  }
  Colour<unsigned_char,_255,_false>::Colour
            ((Colour<unsigned_char,_255,_false> *)(hex_values + 2),'\0',0xff);
  colour->red = hex_values[2][0];
  colour->green = hex_values[2][1];
  colour->blue = hex_values[3][0];
  colour->alpha = hex_values[3][1];
  pcVar8 = (char *)::std::__cxx11::string::operator[]((ulong)value);
  if (*pcVar8 == '#') {
    _tens = 0x6666666666666666;
    uVar9 = ::std::__cxx11::string::size();
    switch(uVar9) {
    case 5:
      puVar10 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)value);
      _tens = CONCAT16(*puVar10,_tens);
      _tens = CONCAT17(*puVar10,_tens);
    case 4:
      puVar10 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)value);
      _tens = CONCAT71(CONCAT61(stack0xffffffffffffffd2,*puVar10),*puVar10);
      puVar10 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)value);
      _tens = CONCAT53(CONCAT41(i,*puVar10),CONCAT12(*puVar10,(undefined2)tens));
      puVar10 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)value);
      _tens = CONCAT35(CONCAT21(i._2_2_,*puVar10),CONCAT14(*puVar10,tens));
      break;
    default:
      colour_local._7_1_ = 0;
      goto LAB_005e8783;
    case 9:
      puVar10 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)value);
      _tens = CONCAT16(*puVar10,_tens);
      puVar10 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)value);
      _tens = CONCAT17(*puVar10,_tens);
    case 7:
      lVar13 = ::std::__cxx11::string::c_str();
      _tens = CONCAT26(i._2_2_,*(undefined6 *)(lVar13 + 1));
    }
    for (ones = 0; ones < 4; ones = ones + 1) {
      local_38 = Math::HexToDecimal(*(char *)((long)&tens + (long)ones * 2));
      local_3c = Math::HexToDecimal(*(char *)((long)&tens + (long)ones * 2 + 1));
      if ((local_38 == -1) || (local_3c == -1)) {
        colour_local._7_1_ = 0;
        goto LAB_005e8783;
      }
      iVar6 = local_38 << 4;
      cVar1 = (char)local_3c;
      puVar15 = Colour::operator_cast_to_unsigned_char_((Colour *)colour);
      puVar15[ones] = (char)iVar6 + cVar1;
    }
  }
  else {
    ::std::__cxx11::string::substr((ulong)&local_60,(ulong)value);
    values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    bVar5 = ::std::operator==(&local_60,"rgb");
    local_2a1 = true;
    if (!bVar5) {
      ::std::__cxx11::string::substr((ulong)&local_90,(ulong)value);
      values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      local_2a1 = ::std::operator==(&local_90,"hsl");
    }
    if ((values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      ::std::__cxx11::string::~string((string *)&local_90);
    }
    ::std::__cxx11::string::~string((string *)&local_60);
    if (local_2a1 == false) {
      pTVar16 = &ControlledLifetimeResource<Rml::PropertyParserColourData>::operator->
                           ((ControlledLifetimeResource<Rml::PropertyParserColourData> *)parser_data
                           )->html_colours;
      ::std::__cxx11::string::string((string *)&local_278,(string *)value);
      StringUtilities::ToLower(&local_258,&local_278);
      cVar19 = robin_hood::detail::
               Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Colour<unsigned_char,_255,_false>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(pTVar16,&local_258);
      it.mKeyVals = (NodePtr)cVar19.mInfo;
      local_238 = (undefined1  [8])cVar19.mKeyVals;
      ::std::__cxx11::string::~string((string *)&local_258);
      ::std::__cxx11::string::~string((string *)&local_278);
      pTVar16 = &ControlledLifetimeResource<Rml::PropertyParserColourData>::operator->
                           ((ControlledLifetimeResource<Rml::PropertyParserColourData> *)parser_data
                           )->html_colours;
      local_288 = robin_hood::detail::
                  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Colour<unsigned_char,_255,_false>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(pTVar16);
      bVar5 = robin_hood::detail::
              Table<true,80ul,std::__cxx11::string,Rml::Colour<unsigned_char,255,false>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              ::Iter<true>::operator==((Iter<true> *)local_238,&local_288);
      if (bVar5) {
        colour_local._7_1_ = 0;
        goto LAB_005e8783;
      }
      ppVar17 = robin_hood::detail::
                Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Colour<unsigned_char,_255,_false>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::Iter<true>::operator->((Iter<true> *)local_238);
      uVar2 = (ppVar17->second).green;
      uVar3 = (ppVar17->second).blue;
      uVar4 = (ppVar17->second).alpha;
      colour->red = (ppVar17->second).red;
      colour->green = uVar2;
      colour->blue = uVar3;
      colour->alpha = uVar4;
    }
    else {
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&find);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&find,4);
      local_b8 = ::std::__cxx11::string::find((char)value,0x28);
      if (local_b8 == -1) {
        colour_local._7_1_ = 0;
        begin_values._4_4_ = 1;
        goto LAB_005e8625;
      }
      local_c8 = local_b8 + 1;
      ::std::__cxx11::string::rfind((char)value,0x29);
      ::std::__cxx11::string::substr((ulong)&local_e8,(ulong)value);
      StringUtilities::ExpandString((StringList *)&find,&local_e8,',');
      ::std::__cxx11::string::~string((string *)&local_e8);
      ::std::__cxx11::string::substr((ulong)&local_108,(ulong)value);
      bVar5 = ::std::operator==(&local_108,"rgb");
      ::std::__cxx11::string::~string((string *)&local_108);
      if (bVar5) {
        uVar7 = ::std::__cxx11::string::size();
        if ((uVar7 < 4) ||
           (pcVar8 = (char *)::std::__cxx11::string::operator[]((ulong)value), *pcVar8 != 'a')) {
          sVar11 = ::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&find);
          if (sVar11 == 3) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&i_1,"255",(allocator<char> *)((long)&component + 3));
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&find,(value_type *)&i_1);
            ::std::__cxx11::string::~string((string *)&i_1);
            ::std::allocator<char>::~allocator((allocator<char> *)((long)&component + 3));
            goto LAB_005e7fc1;
          }
          colour_local._7_1_ = 0;
          begin_values._4_4_ = 1;
        }
        else {
          sVar11 = ::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&find);
          if (sVar11 == 4) {
LAB_005e7fc1:
            for (local_130 = 0; local_130 < 4; local_130 = local_130 + 1) {
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&find,(long)local_130);
              lVar13 = ::std::__cxx11::string::size();
              if (lVar13 == 0) {
LAB_005e80fe:
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&find,(long)local_130);
                pcVar8 = (char *)::std::__cxx11::string::c_str();
                local_134 = atoi(pcVar8);
              }
              else {
                pvVar14 = ::std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)&find,(long)local_130);
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&find,(long)local_130);
                ::std::__cxx11::string::size();
                pcVar8 = (char *)::std::__cxx11::string::operator[]((ulong)pvVar14);
                if (*pcVar8 != '%') goto LAB_005e80fe;
                pvVar14 = ::std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)&find,(long)local_130);
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&find,(long)local_130);
                ::std::__cxx11::string::size();
                ::std::__cxx11::string::substr((ulong)local_158,(ulong)pvVar14);
                pcVar8 = (char *)::std::__cxx11::string::c_str();
                dVar18 = atof(pcVar8);
                local_134 = (int)((float)dVar18 * 2.55);
                ::std::__cxx11::string::~string(local_158);
              }
              iVar6 = Math::Clamp<int>(local_134,0,0xff);
              puVar15 = Colour::operator_cast_to_unsigned_char_((Colour *)colour);
              puVar15[local_130] = (uchar)iVar6;
            }
            goto LAB_005e861b;
          }
          colour_local._7_1_ = 0;
          begin_values._4_4_ = 1;
        }
      }
      else {
        uVar7 = ::std::__cxx11::string::size();
        if ((uVar7 < 4) ||
           (pcVar8 = (char *)::std::__cxx11::string::operator[]((ulong)value), *pcVar8 != 'a')) {
          sVar11 = ::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&find);
          if (sVar11 == 3) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string<std::allocator<char>>
                      ((string *)(vals._M_elems + 3),"1.0",
                       (allocator<char> *)((long)vals._M_elems + 0xb));
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&find,(value_type *)(vals._M_elems + 3));
            ::std::__cxx11::string::~string((string *)(vals._M_elems + 3));
            ::std::allocator<char>::~allocator((allocator<char> *)((long)vals._M_elems + 0xb));
            goto LAB_005e8298;
          }
          colour_local._7_1_ = 0;
          begin_values._4_4_ = 1;
        }
        else {
          sVar11 = ::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&find);
          if (sVar11 == 4) {
LAB_005e8298:
            __begin4._0_4_ = 0;
            __begin4._4_4_ = 3;
            local_1a8._M_array = (iterator)&__begin4;
            local_1a8._M_len = 2;
            local_198 = &local_1a8;
            __end4 = ::std::initializer_list<int>::begin(local_198);
            piStack_1c0 = ::std::initializer_list<int>::end(local_198);
            for (; __end4 != piStack_1c0; __end4 = __end4 + 1) {
              __range4_1._4_4_ = *__end4;
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&find,(long)__range4_1._4_4_);
              pcVar8 = (char *)::std::__cxx11::string::c_str();
              dVar18 = atof(pcVar8);
              pvVar12 = ::std::array<float,_4UL>::operator[]
                                  ((array<float,_4UL> *)((long)&__range4 + 4),(long)__range4_1._4_4_
                                  );
              *pvVar12 = (float)dVar18;
            }
            __begin4_1._0_4_ = 1;
            __begin4_1._4_4_ = 2;
            local_1e0._M_array = (iterator)&__begin4_1;
            local_1e0._M_len = 2;
            local_1d0 = &local_1e0;
            __end4_1 = ::std::initializer_list<int>::begin(local_1d0);
            piStack_1f8 = ::std::initializer_list<int>::end(local_1d0);
            for (; __end4_1 != piStack_1f8; __end4_1 = __end4_1 + 1) {
              local_1fc = *__end4_1;
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&find,(long)local_1fc);
              lVar13 = ::std::__cxx11::string::size();
              if (lVar13 == 0) {
LAB_005e8544:
                colour_local._7_1_ = 0;
                begin_values._4_4_ = 1;
                goto LAB_005e8625;
              }
              pvVar14 = ::std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&find,(long)local_1fc);
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&find,(long)local_1fc);
              ::std::__cxx11::string::size();
              pcVar8 = (char *)::std::__cxx11::string::operator[]((ulong)pvVar14);
              if (*pcVar8 != '%') goto LAB_005e8544;
              pvVar14 = ::std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&find,(long)local_1fc);
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&find,(long)local_1fc);
              ::std::__cxx11::string::size();
              ::std::__cxx11::string::substr((ulong)local_220,(ulong)pvVar14);
              pcVar8 = (char *)::std::__cxx11::string::c_str();
              dVar18 = atof(pcVar8);
              pvVar12 = ::std::array<float,_4UL>::operator[]
                                  ((array<float,_4UL> *)((long)&__range4 + 4),(long)local_1fc);
              *pvVar12 = (float)dVar18 * 0.01;
              ::std::__cxx11::string::~string(local_220);
            }
            HSLAToRGBA((Array<float,_4> *)((long)&__range4 + 4));
            for (it.mInfo._4_4_ = 0; it.mInfo._4_4_ < 4; it.mInfo._4_4_ = it.mInfo._4_4_ + 1) {
              pvVar12 = ::std::array<float,_4UL>::operator[]
                                  ((array<float,_4UL> *)((long)&__range4 + 4),(long)it.mInfo._4_4_);
              iVar6 = Math::Clamp<int>((int)(*pvVar12 * 255.0),0,0xff);
              puVar15 = Colour::operator_cast_to_unsigned_char_((Colour *)colour);
              puVar15[it.mInfo._4_4_] = (uchar)iVar6;
            }
LAB_005e861b:
            begin_values._4_4_ = 0;
          }
          else {
            colour_local._7_1_ = 0;
            begin_values._4_4_ = 1;
          }
        }
      }
LAB_005e8625:
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&find);
      if (begin_values._4_4_ != 0) goto LAB_005e8783;
    }
  }
  colour_local._7_1_ = 1;
LAB_005e8783:
  return (bool)(colour_local._7_1_ & 1);
}

Assistant:

bool PropertyParserColour::ParseColour(Colourb& colour, const String& value)
{
	if (value.empty())
		return false;

	colour = {};

	// Check for a hex colour.
	if (value[0] == '#')
	{
		char hex_values[4][2] = {{'f', 'f'}, {'f', 'f'}, {'f', 'f'}, {'f', 'f'}};

		switch (value.size())
		{
		// Single hex digit per channel, RGB and alpha.
		case 5:
			hex_values[3][0] = hex_values[3][1] = value[4];
			//-fallthrough
		// Single hex digit per channel, RGB only.
		case 4:
			hex_values[0][0] = hex_values[0][1] = value[1];
			hex_values[1][0] = hex_values[1][1] = value[2];
			hex_values[2][0] = hex_values[2][1] = value[3];
			break;

		// Two hex digits per channel, RGB and alpha.
		case 9:
			hex_values[3][0] = value[7];
			hex_values[3][1] = value[8];
			//-fallthrough
		// Two hex digits per channel, RGB only.
		case 7: memcpy(hex_values, &value.c_str()[1], sizeof(char) * 6); break;

		default: return false;
		}

		// Parse each of the colour elements.
		for (int i = 0; i < 4; i++)
		{
			int tens = Math::HexToDecimal(hex_values[i][0]);
			int ones = Math::HexToDecimal(hex_values[i][1]);
			if (tens == -1 || ones == -1)
				return false;

			colour[i] = (byte)(tens * 16 + ones);
		}
	}
	else if (value.substr(0, 3) == "rgb" || value.substr(0, 3) == "hsl")
	{
		StringList values;
		values.reserve(4);

		size_t find = value.find('(');
		if (find == String::npos)
			return false;

		size_t begin_values = find + 1;

		StringUtilities::ExpandString(values, value.substr(begin_values, value.rfind(')') - begin_values), ',');

		if (value.substr(0, 3) == "rgb")
		{
			// Check if we're parsing an 'rgba' or 'rgb' colour declaration.
			if (value.size() > 3 && value[3] == 'a')
			{
				if (values.size() != 4)
					return false;
			}
			else
			{
				if (values.size() != 3)
					return false;

				values.push_back("255");
			}

			// Parse the RGBA values.
			for (int i = 0; i < 4; ++i)
			{
				int component;

				// We're parsing a percentage value.
				if (values[i].size() > 0 && values[i][values[i].size() - 1] == '%')
					component = int((float)atof(values[i].substr(0, values[i].size() - 1).c_str()) * (255.0f / 100.0f));
				// We're parsing a 0 -> 255 integer value.
				else
					component = atoi(values[i].c_str());

				colour[i] = (byte)(Math::Clamp(component, 0, 255));
			}
		}
		else
		{
			// Check if we're parsing an 'hsla' or 'hsl' colour declaration.
			if (value.size() > 3 && value[3] == 'a')
			{
				if (values.size() != 4)
					return false;
			}
			else
			{
				if (values.size() != 3)
					return false;

				values.push_back("1.0");
			}

			// Parse the HSLA values.
			Array<float, 4> vals;
			// H is a number in degrees, A is a number between 0.0 and 1.0.
			for (int i : {0, 3})
				vals[i] = (float)atof(values[i].c_str());
			// S and L are percentage values.
			for (int i : {1, 2})
				if (values[i].size() > 0 && values[i][values[i].size() - 1] == '%')
					vals[i] = (float)atof(values[i].substr(0, values[i].size() - 1).c_str()) * (1.0f / 100.0f);
				else
					return false;

			HSLAToRGBA(vals);
			for (int i = 0; i < 4; ++i)
			{
				colour[i] = (byte)(Math::Clamp((int)(vals[i] * 255.0f), 0, 255));
			}
		}
	}
	else
	{
		// Check for the specification of an HTML colour.
		auto it = parser_data->html_colours.find(StringUtilities::ToLower(value));
		if (it == parser_data->html_colours.end())
			return false;
		else
			colour = it->second;
	}

	return true;
}